

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3ParserFree(void *p,_func_void_void_ptr *freeProc)

{
  code *in_RSI;
  yyParser *in_RDI;
  yyParser *pParser;
  yyParser *pParser_00;
  
  pParser_00 = in_RDI;
  if (in_RDI != (yyParser *)0x0) {
    while (-1 < in_RDI->yyidx) {
      yy_pop_parser_stack(pParser_00);
    }
    (*in_RSI)(in_RDI);
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3ParserFree(
  void *p,                    /* The parser to be deleted */
  void (*freeProc)(void*)     /* Function used to reclaim memory */
){
  yyParser *pParser = (yyParser*)p;
  /* In SQLite, we never try to destroy a parser that was not successfully
  ** created in the first place. */
  if( NEVER(pParser==0) ) return;
  while( pParser->yyidx>=0 ) yy_pop_parser_stack(pParser);
#if YYSTACKDEPTH<=0
  free(pParser->yystack);
#endif
  (*freeProc)((void*)pParser);
}